

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O3

int arkInterpInit_Lagrange(ARKodeMem_conflict ark_mem,ARKInterp I,sunrealtype tnew)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  uint *puVar8;
  
  puVar8 = (uint *)I->content;
  if ((int)puVar8[1] < (int)*puVar8) {
    if (*(void **)(puVar8 + 4) != (void *)0x0) {
      free(*(void **)(puVar8 + 4));
      puVar8 = (uint *)I->content;
      puVar8[4] = 0;
      puVar8[5] = 0;
    }
    pvVar4 = *(void **)(puVar8 + 2);
    if (pvVar4 != (void *)0x0) {
      uVar1 = *puVar8;
      if (0 < (int)uVar1) {
        lVar6 = 0;
        lVar7 = 0;
        do {
          if (*(long *)(*(long *)(puVar8 + 2) + lVar6) != 0) {
            arkFreeVec(ark_mem,(N_Vector *)(*(long *)(puVar8 + 2) + lVar6));
            *(undefined8 *)(*(long *)((long)I->content + 8) + lVar6) = 0;
            puVar8 = (uint *)I->content;
            uVar1 = *puVar8;
          }
          lVar7 = lVar7 + 1;
          lVar6 = lVar6 + 8;
        } while (lVar7 < (int)uVar1);
        pvVar4 = *(void **)(puVar8 + 2);
      }
      free(pvVar4);
      puVar8 = (uint *)I->content;
      puVar8[2] = 0;
      puVar8[3] = 0;
    }
  }
  if (*(long *)(puVar8 + 4) == 0) {
    pvVar4 = malloc((long)(int)*puVar8 << 3);
    *(void **)(puVar8 + 4) = pvVar4;
    if (pvVar4 != (void *)0x0) goto LAB_001343f0;
LAB_001344d8:
    (*I->ops->free)(ark_mem,I);
    iVar3 = -0x14;
  }
  else {
LAB_001343f0:
    uVar1 = *puVar8;
    if (*(long *)(puVar8 + 2) == 0) {
      pvVar4 = malloc((long)(int)uVar1 << 3);
      *(void **)(puVar8 + 2) = pvVar4;
      if (pvVar4 == (void *)0x0) goto LAB_001344d8;
      if (0 < (int)uVar1) {
        lVar7 = 0;
        lVar6 = 0;
        do {
          *(undefined8 *)(*(long *)(puVar8 + 2) + lVar7) = 0;
          iVar2 = arkAllocVec(ark_mem,ark_mem->yn,
                              (N_Vector *)(*(long *)((long)I->content + 8) + lVar7));
          if (iVar2 == 0) goto LAB_001344d8;
          lVar6 = lVar6 + 1;
          puVar8 = (uint *)I->content;
          uVar1 = *puVar8;
          lVar7 = lVar7 + 8;
        } while (lVar6 < (int)uVar1);
      }
    }
    uVar5 = puVar8[1];
    if ((int)puVar8[1] < (int)uVar1) {
      puVar8[1] = uVar1;
      uVar5 = uVar1;
    }
    if (0 < (int)uVar5) {
      memset(*(void **)(puVar8 + 4),0,(ulong)uVar5 << 3);
    }
    iVar2 = N_VConstVectorArray(0,uVar5,*(undefined8 *)(puVar8 + 2));
    iVar3 = -0x1c;
    if (iVar2 == 0) {
      pvVar4 = I->content;
      **(sunrealtype **)((long)pvVar4 + 0x10) = tnew;
      N_VScale(0x3ff0000000000000,ark_mem->yn,**(undefined8 **)((long)pvVar4 + 8));
      *(undefined4 *)((long)I->content + 0x18) = 1;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int arkInterpInit_Lagrange(ARKodeMem ark_mem, ARKInterp I, sunrealtype tnew)
{
  int i;

  /* check if storage has increased since the last init */
  if (LINT_NMAX(I) > LINT_NMAXALLOC(I))
  {
    if (LINT_THIST(I) != NULL)
    {
      free(LINT_THIST(I));
      LINT_THIST(I) = NULL;
    }
    if (LINT_YHIST(I) != NULL)
    {
      for (i = 0; i < LINT_NMAX(I); i++)
      {
        if (LINT_YJ(I, i) != NULL)
        {
          arkFreeVec(ark_mem, &(LINT_YJ(I, i)));
          LINT_YJ(I, i) = NULL;
        }
      }
      free(LINT_YHIST(I));
      LINT_YHIST(I) = NULL;
    }
  }

  /* allocate storage for time and solution histories */
  if (LINT_THIST(I) == NULL)
  {
    LINT_THIST(I) = (sunrealtype*)malloc(LINT_NMAX(I) * sizeof(sunrealtype));
    if (LINT_THIST(I) == NULL)
    {
      arkInterpFree(ark_mem, I);
      return (ARK_MEM_FAIL);
    }
  }

  /* solution history allocation */
  if (LINT_YHIST(I) == NULL)
  {
    LINT_YHIST(I) = (N_Vector*)malloc(LINT_NMAX(I) * sizeof(N_Vector));
    if (LINT_YHIST(I) == NULL)
    {
      arkInterpFree(ark_mem, I);
      return (ARK_MEM_FAIL);
    }
    for (i = 0; i < LINT_NMAX(I); i++)
    {
      LINT_YJ(I, i) = NULL;
      if (!arkAllocVec(ark_mem, ark_mem->yn, &(LINT_YJ(I, i))))
      {
        arkInterpFree(ark_mem, I);
        return (ARK_MEM_FAIL);
      }
    }
  }

  /* update allocated size if necessary */
  if (LINT_NMAX(I) > LINT_NMAXALLOC(I)) { LINT_NMAXALLOC(I) = LINT_NMAX(I); }

  /* zero out history (to be safe) */
  for (i = 0; i < LINT_NMAXALLOC(I); i++) { LINT_TJ(I, i) = SUN_RCONST(0.0); }
  if (N_VConstVectorArray(LINT_NMAXALLOC(I), SUN_RCONST(0.0), LINT_YHIST(I)))
  {
    return (ARK_VECTOROP_ERR);
  }

  /* set current time and state as first entries of (t,y) history, update counter */
  LINT_TJ(I, 0) = tnew;
  N_VScale(ONE, ark_mem->yn, LINT_YJ(I, 0));
  LINT_NHIST(I) = 1;

  /* return with success */
  return (ARK_SUCCESS);
}